

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

deque<int,_ft::allocator<int>_> * __thiscall
ft::deque<int,_ft::allocator<int>_>::operator=
          (deque<int,_ft::allocator<int>_> *this,deque<int,_ft::allocator<int>_> *rhs)

{
  constDequeIterator<int,_64UL> local_78;
  constDequeIterator<int,_64UL> local_50;
  
  if (rhs != this) {
    constDequeIterator<int,_64UL>::constDequeIterator(&local_78,&rhs->m_start);
    constDequeIterator<int,_64UL>::constDequeIterator(&local_50,&rhs->m_finish);
    deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
              ((deque<int,ft::allocator<int>> *)this,&local_78,&local_50,(type *)0x0);
  }
  return this;
}

Assistant:

deque&	operator=(deque const & rhs) {
		if (&rhs != this) {
			this->assign(rhs.begin(), rhs.end());
		}
		return *this;
	}